

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeid.h
# Opt level: O0

string * pybind11::type_id<char_const(&)[1]>(void)

{
  detail *this;
  char *typeid_name;
  string *in_RDI;
  
  this = (detail *)std::type_info::name((type_info *)&char_[1]::typeinfo);
  detail::clean_type_id_abi_cxx11_(in_RDI,this,typeid_name);
  return in_RDI;
}

Assistant:

static std::string type_id() {
    return detail::clean_type_id(typeid(T).name());
}